

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push.c
# Opt level: O3

int push0_set_send_buf_len(void *arg,void *buf,size_t sz,nni_type t)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  int local_24 [2];
  int val;
  
  local_24[0] = (int)((ulong)in_RAX >> 0x20);
  iVar2 = nni_copyin_int(local_24,buf,sz,0,0x2000,t);
  if (iVar2 == 0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 0x88));
    iVar2 = nni_lmq_resize((nni_lmq *)arg,(long)local_24[0]);
    _Var1 = nni_lmq_full((nni_lmq *)arg);
    if (_Var1) {
      iVar3 = nni_list_empty((nni_list *)((long)arg + 0x60));
      if (iVar3 != 0) {
        nni_pollable_clear((nni_pollable *)((long)arg + 0x78));
      }
    }
    else {
      nni_pollable_raise((nni_pollable *)((long)arg + 0x78));
    }
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x88));
  }
  return iVar2;
}

Assistant:

static int
push0_set_send_buf_len(void *arg, const void *buf, size_t sz, nni_type t)
{
	push0_sock *s = arg;
	int         val;
	int         rv;

	if ((rv = nni_copyin_int(&val, buf, sz, 0, 8192, t)) != 0) {
		return (rv);
	}
	nni_mtx_lock(&s->m);
	rv = nni_lmq_resize(&s->wq, (size_t) val);
	// Changing the size of the queue can affect our readiness.
	if (!nni_lmq_full(&s->wq)) {
		nni_pollable_raise(&s->writable);
	} else if (nni_list_empty(&s->pl)) {
		nni_pollable_clear(&s->writable);
	}
	nni_mtx_unlock(&s->m);
	return (rv);
}